

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O0

void decode_16(FILE *f,uint w,uint h)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *local_48;
  uchar *ptr;
  uint local_38;
  uint pix;
  uint c;
  uint p;
  uint y;
  uint x;
  uint n;
  uint j;
  uint i;
  int k;
  uint h_local;
  uint w_local;
  FILE *f_local;
  
  local_48 = pcx_buf;
  p = 0;
  c = 0;
  pix = 0;
  if (pcx.encoding == '\0') {
    error("Unsupported PCX encoding scheme!");
  }
  else {
    if (pcx.encoding != '\x01') {
      error("Unsupported PCX encoding scheme!");
      return;
    }
    do {
      local_38 = fgetc((FILE *)f);
      if (local_38 == 0xffffffff) break;
      if ((local_38 & 0xc0) == 0xc0) {
        n = local_38 & 0x3f;
        local_38 = fgetc((FILE *)f);
      }
      else {
        n = 1;
      }
      do {
        pcx_plane[p >> 3][pix] = (uchar)local_38;
        p = p + 8;
        if (w <= p) {
          p = 0;
          pix = pix + 1;
          if (pix == pcx.np) {
            pix = 0;
            c = c + 1;
            for (x = 0; x < w + 7 >> 3; x = x + 1) {
              j = 7;
              while (-1 < (int)j) {
                ptr._4_1_ = 0;
                bVar3 = ptr._4_1_;
                ptr._4_1_ = 0;
                bVar2 = ptr._4_1_;
                ptr._4_1_ = 0;
                bVar1 = ptr._4_1_;
                ptr._4_1_ = 0;
                bVar4 = (byte)j;
                switch(pcx.np) {
                case '\x04':
                  bVar3 = (byte)(((int)(uint)pcx_plane[x][3] >> (bVar4 & 0x1f) & 1U) << 3);
                case '\x03':
                  ptr._4_1_ = bVar3;
                  bVar2 = (byte)(((int)(uint)pcx_plane[x][2] >> (bVar4 & 0x1f) & 1U) << 2) |
                          ptr._4_1_;
                case '\x02':
                  ptr._4_1_ = bVar2;
                  bVar1 = (byte)(((int)(uint)pcx_plane[x][1] >> (bVar4 & 0x1f) & 1U) << 1) |
                          ptr._4_1_;
                case '\x01':
                  ptr._4_1_ = bVar1;
                  ptr._4_1_ = (byte)((int)(uint)pcx_plane[x][0] >> (bVar4 & 0x1f)) & 1 | ptr._4_1_;
                default:
                  if (p < w) {
                    *local_48 = ptr._4_1_;
                    local_48 = local_48 + 1;
                  }
                  p = p + 1;
                  j = j - 1;
                }
              }
            }
          }
          p = 0;
        }
        n = n - 1;
      } while (n != 0);
    } while (c < h);
  }
  memset(pcx_pal,0,0x300);
  memcpy(pcx_pal,pcx.colormap,(long)((1 << (pcx.np & 0x1f)) * 3));
  pcx_nb_colors = 0x10;
  return;
}

Assistant:

void
decode_16(FILE *f, unsigned int w, unsigned int h)
{
    int k;
	unsigned int i, j, n;
	unsigned int x, y, p;
	unsigned int c, pix;
	unsigned char *ptr;

	ptr = pcx_buf;
	x = 0;
	y = 0;
	p = 0;

	/* decode */
	switch (pcx.encoding) {
	case 0:
		/* raw */
		error("Unsupported PCX encoding scheme!");
		break;

	case 1:
		/* simple run-length encoding */
		do {
			/* get a char */
			c = fgetc(f);
			if (c == uEOF)
				break;

			/* check if it's a repeat command */
			if ((c & 0xC0) != 0xC0)
				i = 1;
			else {
				i = (c & 0x3F);
				c = fgetc(f);
			}

			/* unpack */
			do {
			    pcx_plane[x >> 3][p] = c;
				x += 8;

				/* end of line */
				if (x >= w) {
					x = 0;
					p++;

					/* plane to chunky conversion */
					if (p == pcx.np) {
						p = 0;
						n = (w + 7) >> 3;
						y++;

						/* loop */
						for (j = 0; j < n; j++) {
							for (k = 7; k >= 0; k--) {
								/* get pixel index */
								pix = 0;

								switch (pcx.np) {
								case 4:
									pix |= ((pcx_plane[j][3] >> k) & 0x01) << 3;
								case 3:
									pix |= ((pcx_plane[j][2] >> k) & 0x01) << 2;
								case 2:
									pix |= ((pcx_plane[j][1] >> k) & 0x01) << 1;
								case 1:
									pix |= ((pcx_plane[j][0] >> k) & 0x01);
									break;
								}

								/* store pixel */
								if (x < w)
									*ptr++ = pix;

								x++;
							}
						}
						x = 0;
					}
				}
			}
			while (--i);
		}
		while (y < h);
		break;

	default:
		error("Unsupported PCX encoding scheme!");
		return;
	}			

	/* get the palette */
	memset(pcx_pal, 0, 768);
	memcpy(pcx_pal, pcx.colormap, (1 << pcx.np) * 3);

	/* number of colors */
	pcx_nb_colors = 16;
}